

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

char * __thiscall cmCustomCommandGenerator::GetArgv0Location(cmCustomCommandGenerator *this,uint c)

{
  bool bVar1;
  bool bVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  TargetType TVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  cmMakefile *this_02;
  byte local_a1;
  byte local_94;
  allocator<char> local_91;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmGeneratorTarget *local_30;
  cmGeneratorTarget *target;
  string *argv0;
  cmCustomCommandGenerator *pcStack_18;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  argv0._4_4_ = c;
  pcStack_18 = this;
  this_01 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                       (&(this->CommandLines).
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                        (ulong)c)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  target = (cmGeneratorTarget *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_01,0);
  local_30 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)target);
  local_5a = 0;
  local_6d = 0;
  bVar2 = false;
  bVar1 = false;
  local_94 = 0;
  if (local_30 != (cmGeneratorTarget *)0x0) {
    TVar4 = cmGeneratorTarget::GetType(local_30);
    local_94 = 0;
    if (TVar4 == EXECUTABLE) {
      bVar3 = cmGeneratorTarget::IsImported(local_30);
      this_00 = local_30;
      local_a1 = 1;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_5a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"CROSSCOMPILING_EMULATOR",&local_59);
        local_6d = 1;
        local_38 = cmGeneratorTarget::GetProperty(this_00,&local_58);
        bVar3 = cmValue::operator_cast_to_bool(&local_38);
        local_a1 = 1;
        if (!bVar3) {
          this_02 = cmLocalGenerator::GetMakefile(this->LG);
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"CMAKE_CROSSCOMPILING",&local_91);
          bVar1 = true;
          bVar3 = cmMakefile::IsOn(this_02,&local_90);
          local_a1 = bVar3 ^ 0xff;
        }
      }
      local_94 = local_a1;
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_91);
  }
  if ((local_6d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator(&local_59);
  }
  if ((local_94 & 1) == 0) {
    this_local = (cmCustomCommandGenerator *)0x0;
  }
  else {
    cmGeneratorTarget::GetLocation(local_30,&this->CommandConfig);
    this_local = (cmCustomCommandGenerator *)std::__cxx11::string::c_str();
  }
  return (char *)this_local;
}

Assistant:

const char* cmCustomCommandGenerator::GetArgv0Location(unsigned int c) const
{
  // If the command is the plain name of an executable target, we replace it
  // with the path to the executable artifact in the command config.
  std::string const& argv0 = this->CommandLines[c][0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
      (target->IsImported() ||
       target->GetProperty("CROSSCOMPILING_EMULATOR") ||
       !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING"))) {
    return target->GetLocation(this->CommandConfig).c_str();
  }
  return nullptr;
}